

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O0

void __thiscall
DSDcc::CRC::CRC(CRC *this,unsigned_long polynomial,int order,unsigned_long crcinit,
               unsigned_long crcxor,int direct,int refin,int refout)

{
  CRC *in_RCX;
  uint in_EDX;
  EVP_PKEY_CTX *in_RSI;
  CRC *in_RDI;
  unsigned_long in_R8;
  int in_R9D;
  int in_stack_00000008;
  
  in_RDI->m_order = in_EDX;
  in_RDI->m_poly = (unsigned_long)in_RSI;
  in_RDI->m_direct = in_R9D;
  in_RDI->m_crcinit = (unsigned_long)in_RCX;
  in_RDI->m_crcxor = in_R8;
  in_RDI->m_refin = in_stack_00000008;
  in_RDI->m_refout = (int)crcxor;
  in_RDI->m_crcmask = ((1L << ((char)in_RDI->m_order - 1U & 0x3f)) + -1) * 2 | 1;
  in_RDI->m_crchighbit = 1L << ((char)in_RDI->m_order - 1U & 0x3f);
  generate_crc_table(in_RCX);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

CRC::CRC(unsigned long polynomial,
            int order,
            unsigned long crcinit,
            unsigned long crcxor,
            int direct,
            int refin,
            int refout) :
        m_order(order),
        m_poly(polynomial),
        m_direct(direct),
        m_crcinit(crcinit),
        m_crcxor(crcxor),
        m_refin(refin),
        m_refout(refout)
{
    m_crcmask = ((((unsigned long) 1 << (m_order - 1)) - 1) << 1) | 1;
    m_crchighbit = (unsigned long) 1 << (m_order - 1);

    generate_crc_table();
    init();
}